

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O1

Am_Value __thiscall Am_Load_Save_Context::Load(Am_Load_Save_Context *this,istream *is)

{
  _Base_ptr *pp_Var1;
  uint uVar2;
  _Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
  *this_00;
  map<int,_Wrapper_Holder,_std::less<int>,_std::allocator<std::pair<const_int,_Wrapper_Holder>_>_>
  *this_01;
  Wrapper_Holder initial;
  bool bVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  long *plVar7;
  long lVar8;
  istream *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_01;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_02;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_03;
  anon_union_8_8_ea4c8939_for_value aVar9;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_04;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_05;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_06;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_07;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_08;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_09;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_10;
  _Rb_tree_header *p_Var10;
  Am_Value AVar11;
  char ch;
  int number;
  int base;
  char type_name [100];
  char local_b9;
  undefined1 local_b8 [32];
  Map<int,_Wrapper_Holder,_std::less<int>_> local_98;
  
  if (*(long *)is == 0) {
    Am_Error("Load called on a (0L) load/save context");
  }
  std::operator>>(in_RDX,&local_b9);
  initial = No_Wrapper;
  switch((int)local_b9 - 0x44U >> 1 | (uint)(((int)local_b9 - 0x44U & 1) != 0) << 0x1f) {
  case 0:
    plVar7 = (long *)std::istream::operator>>((istream *)in_RDX,(int *)local_b8);
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
      *(undefined4 *)(*(long *)is + 0x40) = local_b8._0_4_;
      lVar8 = *(long *)(in_RDX + *(long *)(*(long *)in_RDX + -0x18) + 0x10);
      std::__istream_extract(in_RDX,(char *)(local_b8 + 0x20),100);
      if (((*(int *)(in_RDX + *(long *)(*(long *)in_RDX + -0x18) + 0x20) == 0) &&
          (lVar8 - 0x65U < 0xffffffffffffff9c)) &&
         (*(ulong *)(*(long *)(in_RDX + *(long *)(*(long *)in_RDX + -0x18) + 0xe8) + 0x18) <=
          *(ulong *)(*(long *)(in_RDX + *(long *)(*(long *)in_RDX + -0x18) + 0xe8) + 0x10))) {
        Load();
      }
      if (((byte)in_RDX[*(long *)(*(long *)in_RDX + -0x18) + 0x20] & 5) == 0) {
        this_00 = *(_Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
                    **)(*(long *)is + 0x10);
        local_b8._16_8_ = (_Base_ptr)(local_b8 + 0x20);
        cVar4 = std::
                _Rb_tree<const_char_*,_std::pair<const_char_*const,_Am_Load_Method>,_std::_Select1st<std::pair<const_char_*const,_Am_Load_Method>_>,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_Am_Load_Method>_>_>
                ::find(this_00,(key_type *)(local_b8 + 0x10));
        p_Var10 = &this_00[1]._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)cVar4._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
          p_Var10 = (_Rb_tree_header *)&cVar4._M_node[1]._M_left;
        }
        if (*(code **)&p_Var10->_M_header != (code *)0x0) {
          (**(code **)&p_Var10->_M_header)(this);
          bVar3 = Am_Value::Valid((Am_Value *)this);
          aVar9 = extraout_RDX;
          if ((!bVar3) || (((ulong)this->data & 0x7000) != 0x2000)) goto LAB_00224814;
          this_01 = *(map<int,_Wrapper_Holder,_std::less<int>,_std::allocator<std::pair<const_int,_Wrapper_Holder>_>_>
                      **)(*(long *)is + 0x30);
          p_Var5 = (_Base_ptr)Am_Value::operator_cast_to_Am_Wrapper_((Am_Value *)this);
          local_b8._16_4_ = local_b8._0_4_;
          pmVar6 = std::
                   map<int,_Wrapper_Holder,_std::less<int>,_std::allocator<std::pair<const_int,_Wrapper_Holder>_>_>
                   ::operator[](this_01,(key_type *)(local_b8 + 0x10));
          pmVar6->data = (Am_Wrapper *)p_Var5;
          aVar9 = extraout_RDX_00;
          if (p_Var5 == (_Base_ptr)0x0) goto LAB_00224814;
          uVar2 = *(uint *)&p_Var5->_M_parent;
          *(uint *)&p_Var5->_M_parent = uVar2 + 1;
          *(uint *)&p_Var5->_M_parent = uVar2;
          local_98.mMap._M_t._M_impl._0_8_ = p_Var5;
          goto joined_r0x002248ed;
        }
      }
    }
    break;
  case 5:
    if (No_Wrapper.data != (Am_Wrapper *)0x0) {
      (No_Wrapper.data)->refs = (No_Wrapper.data)->refs + 1;
    }
    Am_Value::Am_Value((Am_Value *)this,initial.data);
    aVar9 = extraout_RDX_02;
    goto LAB_00224814;
  case 6:
    lVar8 = *(long *)(in_RDX + *(long *)(*(long *)in_RDX + -0x18) + 0x10);
    p_Var5 = (_Base_ptr)(local_b8 + 0x20);
    std::__istream_extract(in_RDX,(char *)p_Var5,100);
    if (((*(int *)(in_RDX + *(long *)(*(long *)in_RDX + -0x18) + 0x20) == 0) &&
        (lVar8 - 0x65U < 0xffffffffffffff9c)) &&
       (*(ulong *)(*(long *)(in_RDX + *(long *)(*(long *)in_RDX + -0x18) + 0xe8) + 0x18) <=
        *(ulong *)(*(long *)(in_RDX + *(long *)(*(long *)in_RDX + -0x18) + 0xe8) + 0x10))) {
      Load();
    }
    if (((byte)in_RDX[*(long *)(*(long *)in_RDX + -0x18) + 0x20] & 5) == 0) {
      std::istream::get((char *)in_RDX);
      if (local_b9 == ' ') {
        plVar7 = (long *)std::istream::operator>>((istream *)in_RDX,(int *)(local_b8 + 0xc));
        uVar2 = *(uint *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20);
        if ((uVar2 & 5) == 0) {
          local_b8._24_4_ = local_b8._12_4_;
          local_b8._16_8_ = p_Var5;
          OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::GetAt
                    ((Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *)local_b8,
                     *(Name_Num **)(*(long *)is + 0x20));
          p_Var5 = (_Base_ptr)CONCAT44(local_b8._4_4_,local_b8._0_4_);
          aVar9 = extraout_RDX_09;
          if ((p_Var5 != (_Base_ptr)0x0) && (*(uint *)&p_Var5->_M_parent == 0)) {
            (**(code **)(*(long *)p_Var5 + 0x20))(p_Var5);
            aVar9 = extraout_RDX_10;
          }
        }
        else {
          Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
          p_Var5 = (_Base_ptr)0x0;
          aVar9 = extraout_RDX_01;
        }
        if ((uVar2 & 5) == 0) goto LAB_00224890;
      }
      else {
        local_b8._24_4_ = 0xffffffff;
        local_b8._16_8_ = p_Var5;
        OpenAmulet::Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_>::GetAt
                  ((Map<Name_Num,_Wrapper_Holder,_std::less<Name_Num>_> *)local_b8,
                   *(Name_Num **)(*(long *)is + 0x20));
        p_Var5 = (_Base_ptr)CONCAT44(local_b8._4_4_,local_b8._0_4_);
        if ((p_Var5 != (_Base_ptr)0x0) && (*(uint *)&p_Var5->_M_parent == 0)) {
          (**(code **)(*(long *)p_Var5 + 0x20))(p_Var5);
        }
LAB_00224890:
        if (p_Var5 == (_Base_ptr)0x0) {
          Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
          aVar9 = extraout_RDX_07;
        }
        else {
          *(uint *)&p_Var5->_M_parent = *(uint *)&p_Var5->_M_parent + 1;
          Am_Value::Am_Value((Am_Value *)this,(Am_Wrapper *)p_Var5);
          aVar9 = extraout_RDX_05;
        }
      }
      if (p_Var5 == (_Base_ptr)0x0) goto LAB_00224814;
      pp_Var1 = &p_Var5->_M_parent;
      *(uint *)pp_Var1 = *(uint *)pp_Var1 - 1;
      uVar2 = *(uint *)pp_Var1;
      local_98.mMap._M_t._M_impl._0_8_ = p_Var5;
joined_r0x002248ed:
      if (uVar2 != 0) goto LAB_00224814;
      lVar8 = *(long *)local_98.mMap._M_t._M_impl._0_8_;
LAB_002248f9:
      (**(code **)(lVar8 + 0x20))(local_98.mMap._M_t._M_impl._0_8_);
      aVar9 = extraout_RDX_08;
      goto LAB_00224814;
    }
    break;
  case 7:
    plVar7 = (long *)std::istream::operator>>((istream *)in_RDX,(int *)(*(long *)is + 0x40));
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
      OpenAmulet::Map<int,_Wrapper_Holder,_std::less<int>_>::GetAt
                ((Map<int,_Wrapper_Holder,_std::less<int>_> *)(local_b8 + 0x20),
                 *(int **)(*(long *)is + 0x30));
      if ((_Base_ptr)local_98.mMap._M_t._M_impl._0_8_ == (_Base_ptr)0x0) {
        Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
        aVar9 = extraout_RDX_06;
      }
      else {
        *(uint *)(local_98.mMap._M_t._M_impl._0_8_ + 8) =
             *(uint *)(local_98.mMap._M_t._M_impl._0_8_ + 8) + 1;
        Am_Value::Am_Value((Am_Value *)this,(Am_Wrapper *)local_98.mMap._M_t._M_impl._0_8_);
        aVar9 = extraout_RDX_04;
      }
      if ((_Base_ptr)local_98.mMap._M_t._M_impl._0_8_ == (_Base_ptr)0x0) goto LAB_00224814;
      pp_Var1 = (_Base_ptr *)(local_98.mMap._M_t._M_impl._0_8_ + 8);
      *(uint *)pp_Var1 = *(uint *)pp_Var1 - 1;
      if (*(uint *)pp_Var1 != 0) goto LAB_00224814;
      lVar8 = *(long *)local_98.mMap._M_t._M_impl._0_8_;
      goto LAB_002248f9;
    }
  }
  Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
  aVar9 = extraout_RDX_03;
LAB_00224814:
  AVar11.value.wrapper_value = aVar9.wrapper_value;
  AVar11._0_8_ = this;
  return AVar11;
}

Assistant:

Am_Value
Am_Load_Save_Context::Load(std::istream &is)
{
  if (!data) {
    Am_Error("Load called on a (0L) load/save context");
  }

  // operator >> will skip whitespace
  char ch;
  is >> ch;

  // check what type we have
  switch (ch) {
  case 'D': {
    // read in the number
    int number;
    if (!(is >> number)) {
      // ups, there is none...
      return Am_No_Value;
    }
    data->counter = number;

    // read in the type name
    char type_name[100]; // TODO: Remove that 100 chars arbitrary limit
    if (!(is >> type_name)) {
      return Am_No_Value;
    }

    // get the loader-method for the given type-name by asking the
    // map which stores the type-name/loader-method pairs
    Am_Load_Method method = data->loader->GetAt(type_name);

    // did we received a valid method-pointer?
    if (method.Valid() == false) {
      // no
      return Am_No_Value;
    }

    // yes, than read the value
    Am_Value value = method.Call(is, *this);

    // check to see if all types are the same
    if (value.Valid() && Am_Type_Class(value.type) == Am_WRAPPER) {
      data->wrappers->SetAt(number, Wrapper_Holder(value));
    }

    // and return the found value
    return (value);
  }

  case 'R': {
    if (!(is >> data->counter))
      return Am_No_Value;
    // is.get (ch); // skip eoln
    // if (ch != '\n') return Am_No_Value;
    Wrapper_Holder value = data->wrappers->GetAt(data->counter);
    if (!value.Valid())
      return Am_No_Value;
    return Am_Value(value);
  }

  case 'N': {
    // is.get (ch); // skip eoln
    // if (ch != '\n') return Am_No_Value;
    return Am_Value(No_Wrapper);
  }

  case 'P': {
    char name[100]; // TODO: Remove that 100 chars arbitrary limit
    if (!(is >> name))
      return Am_No_Value;
    is.get(ch); // will be space or (part of) EOLN
    Wrapper_Holder value;
    if (ch == ' ') {
      int base;
      if (!(is >> base))
        return Am_No_Value;
      value = data->prototypes->GetAt(Name_Num(name, base));
      // is.get (ch); // skip eoln
      // if (ch != '\n') return Am_No_Value;
    } else
      value = data->prototypes->GetAt(Name_Num(name));
    if (!value.Valid())
      return Am_No_Value;
    return Am_Value(value);
  }

  default: {
    // no known type found...
    return (Am_No_Value);
  }
  }
}